

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3e503::CleanTestCleanFailure::Run(CleanTestCleanFailure *this)

{
  State *state;
  VirtualFileSystem *this_00;
  Test *this_01;
  int iVar1;
  Cleaner cleaner;
  allocator<char> local_c9;
  Cleaner local_c8;
  
  iVar1 = g_current_test->assertion_failures_;
  state = &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,"build dir: cat src1\n",(ManifestParserOptions)0x0);
  if (iVar1 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"dir",&local_c9);
    this_00 = &(this->super_CleanTest).fs_;
    VirtualFileSystem::MakeDir(this_00,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    Cleaner::Cleaner(&local_c8,state,&(this->super_CleanTest).config_,&this_00->super_DiskInterface)
    ;
    this_01 = g_current_test;
    iVar1 = Cleaner::CleanAll(&local_c8,false);
    testing::Test::Check
              (this_01,iVar1 != 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
               ,0x19b,"0 != cleaner.CleanAll()");
    Cleaner::~Cleaner(&local_c8);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanFailure) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
                                      "build dir: cat src1\n"));
  fs_.MakeDir("dir");
  Cleaner cleaner(&state_, config_, &fs_);
  EXPECT_NE(0, cleaner.CleanAll());
}